

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::AdvancedWriteGeometry::Run(AdvancedWriteGeometry *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int h;
  vec3 *expected;
  long lVar5;
  allocator<char> local_cd;
  allocator<char> local_cc;
  allocator<char> local_cb;
  allocator<char> local_ca;
  allocator<char> local_c9;
  float data [8];
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  bVar1 = ShaderStorageBufferObjectBase::SupportedInGS(&this->super_ShaderStorageBufferObjectBase,1)
  ;
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)data,
               "\nlayout(location = 0) in vec4 g_in_position;\nvoid main() {\n  gl_Position = g_in_position;\n}"
               ,&local_c9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,glcts::fixed_sample_locations_values + 1,&local_ca);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,glcts::fixed_sample_locations_values + 1,&local_cb);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,
               "\nlayout(triangles) in;\nlayout(triangle_strip, max_vertices = 3) out;\nlayout(std430, binding = 1) buffer OutputBuffer {\n  vec4 g_output_buffer[];\n};\nvoid main() {\n  for (int i = 0; i < 3; ++i) {\n    const int idx = gl_PrimitiveIDIn * 3 + i;\n    g_output_buffer[idx] = gl_in[i].gl_Position;\n    gl_Position = g_output_buffer[idx];\n    EmitVertex();\n  }\n}"
               ,&local_cc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,
               "\nlayout(location = 0) out vec4 g_fs_out;\nvoid main() {\n  g_fs_out = vec4(0, 1, 0, 1);\n}"
               ,&local_cd);
    GVar2 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,(string *)data,&local_a8,&local_68
                       ,&local_88,&local_48);
    this->m_program[0] = GVar2;
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)data);
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program[0]);
    bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program[0]);
    lVar5 = -1;
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)data,
                 "\nlayout(location = 0) in vec4 g_in_position;\nvoid main() {\n  gl_Position = g_in_position;\n}"
                 ,(allocator<char> *)&local_68);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,
                 "\nlayout(location = 0) out vec4 g_fs_out;\nvoid main() {\n  g_fs_out = vec4(0, 1, 0, 1);\n}"
                 ,(allocator<char> *)&local_88);
      GVar2 = ShaderStorageBufferObjectBase::CreateProgram
                        (&this->super_ShaderStorageBufferObjectBase,(string *)data,&local_a8);
      this->m_program[1] = GVar2;
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)data);
      glu::CallLogWrapper::glLinkProgram(this_00,this->m_program[1]);
      bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                        (&this->super_ShaderStorageBufferObjectBase,this->m_program[1]);
      if (bVar1) {
        data[4] = -1.0;
        data[5] = 1.0;
        data[6] = 1.0;
        data[7] = 1.0;
        data[0] = -1.0;
        data[1] = -1.0;
        data[2] = 1.0;
        data[3] = -1.0;
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_vertex_buffer);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
        glu::CallLogWrapper::glBufferData(this_00,0x8892,0x20,data,0x88e4);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
        glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_storage_buffer);
        glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x60,(void *)0x0,0x88e8);
        glu::CallLogWrapper::glGenVertexArrays(this_00,2,this->m_vertex_array);
        glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array[0]);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
        glu::CallLogWrapper::glVertexAttribPointer(this_00,0,2,0x1406,'\0',0,(void *)0x0);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
        glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
        glu::CallLogWrapper::glBindVertexArray(this_00,0);
        glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array[1]);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_storage_buffer);
        h = 0;
        expected = (vec3 *)0x0;
        glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0,(void *)0x0);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
        glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
        glu::CallLogWrapper::glBindVertexArray(this_00,0);
        glu::CallLogWrapper::glClear(this_00,0x4000);
        glu::CallLogWrapper::glUseProgram(this_00,this->m_program[0]);
        glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array[0]);
        glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
        iVar3 = (*((this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  m_context)->m_renderCtx->_vptr_RenderContext[4])();
        iVar3 = *(int *)CONCAT44(extraout_var,iVar3);
        iVar4 = (*((this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  m_context)->m_renderCtx->_vptr_RenderContext[4])();
        data[0] = 0.0;
        data[1] = 1.0;
        data._8_8_ = data._8_8_ & 0xffffffff00000000;
        bVar1 = ShaderStorageBufferObjectBase::ValidateReadBuffer
                          (&this->super_ShaderStorageBufferObjectBase,iVar3,
                           *(int *)(CONCAT44(extraout_var_00,iVar4) + 4),(int)data,h,expected);
        if (bVar1) {
          glu::CallLogWrapper::glClear(this_00,0x4000);
          glu::CallLogWrapper::glUseProgram(this_00,this->m_program[1]);
          glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array[1]);
          glu::CallLogWrapper::glMemoryBarrier(this_00,1);
          glu::CallLogWrapper::glDrawArrays(this_00,4,0,6);
          iVar3 = (*((this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    m_context)->m_renderCtx->_vptr_RenderContext[4])();
          iVar3 = *(int *)CONCAT44(extraout_var_01,iVar3);
          iVar4 = (*((this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    m_context)->m_renderCtx->_vptr_RenderContext[4])();
          data[0] = 0.0;
          data[1] = 1.0;
          data._8_8_ = data._8_8_ & 0xffffffff00000000;
          bVar1 = ShaderStorageBufferObjectBase::ValidateReadBuffer
                            (&this->super_ShaderStorageBufferObjectBase,iVar3,
                             *(int *)(CONCAT44(extraout_var_02,iVar4) + 4),(int)data,h,expected);
          lVar5 = (ulong)bVar1 - 1;
        }
      }
    }
  }
  else {
    lVar5 = 0x10;
  }
  return lVar5;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInGS(1))
			return NOT_SUPPORTED;

		const char* const glsl_vs = NL "layout(location = 0) in vec4 g_in_position;" NL "void main() {" NL
									   "  gl_Position = g_in_position;" NL "}";

		const char* const glsl_gs =
			NL "layout(triangles) in;" NL "layout(triangle_strip, max_vertices = 3) out;" NL
			   "layout(std430, binding = 1) buffer OutputBuffer {" NL "  vec4 g_output_buffer[];" NL "};" NL
			   "void main() {" NL "  for (int i = 0; i < 3; ++i) {" NL
			   "    const int idx = gl_PrimitiveIDIn * 3 + i;" NL "    g_output_buffer[idx] = gl_in[i].gl_Position;" NL
			   "    gl_Position = g_output_buffer[idx];" NL "    EmitVertex();" NL "  }" NL "}";

		const char* const glsl_fs =
			NL "layout(location = 0) out vec4 g_fs_out;" NL "void main() {" NL "  g_fs_out = vec4(0, 1, 0, 1);" NL "}";

		m_program[0] = CreateProgram(glsl_vs, "", "", glsl_gs, glsl_fs);
		glLinkProgram(m_program[0]);
		if (!CheckProgram(m_program[0]))
			return ERROR;

		m_program[1] = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program[1]);
		if (!CheckProgram(m_program[1]))
			return ERROR;

		/* vertex buffer */
		{
			const float data[] = { -1, -1, 1, -1, -1, 1, 1, 1 };
			glGenBuffers(1, &m_vertex_buffer);
			glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}

		glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 6 * sizeof(float) * 4, NULL, GL_DYNAMIC_DRAW);

		glGenVertexArrays(2, m_vertex_array);

		glBindVertexArray(m_vertex_array[0]);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glBindVertexArray(0);

		glBindVertexArray(m_vertex_array[1]);
		glBindBuffer(GL_ARRAY_BUFFER, m_storage_buffer);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, 0, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glBindVertexArray(0);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program[0]);
		glBindVertexArray(m_vertex_array[0]);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec3(0, 1, 0)))
		{
			return ERROR;
		}

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program[1]);
		glBindVertexArray(m_vertex_array[1]);
		glMemoryBarrier(GL_VERTEX_ATTRIB_ARRAY_BARRIER_BIT);
		glDrawArrays(GL_TRIANGLES, 0, 6);
		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec3(0, 1, 0)))
		{
			return ERROR;
		}

		return NO_ERROR;
	}